

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMinEsop.c
# Opt level: O3

int Min_EsopAddCubeInt(Min_Man_t *p,Min_Cube_t *pCube)

{
  Min_Cube_t **ppMVar1;
  bool bVar2;
  Min_Cube_t **ppMVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  Min_Cube_t *pMVar10;
  Min_Cube_t *pMVar11;
  ulong uVar12;
  Min_Cube_t *pMVar13;
  Min_Cube_t *pMVar14;
  Min_Cube_t *pMVar15;
  Min_Cube_t *pEntry;
  
  ppMVar1 = p->ppStore;
  uVar5 = *(uint *)&pCube->field_0x8;
  uVar8 = (ulong)(uVar5 >> 0x16);
  pMVar13 = (Min_Cube_t *)(ppMVar1 + uVar8);
  pMVar14 = pMVar13->pNext;
  if (pMVar14 != (Min_Cube_t *)0x0) {
    uVar7 = uVar5 >> 10 & 0xfff;
    pMVar10 = pMVar13;
    pMVar11 = pMVar14;
    do {
      pMVar15 = pMVar13;
      pEntry = pMVar14;
      if (uVar7 == 0) {
LAB_0044c3c7:
        pMVar15->pNext = pEntry->pNext;
        Extra_MmFixedEntryRecycle(p->pMemMan,(char *)pCube);
        Extra_MmFixedEntryRecycle(p->pMemMan,(char *)pEntry);
        iVar4 = 0;
        goto LAB_0044c517;
      }
      uVar12 = 0;
      while (pCube->uData[uVar12] == pMVar11->uData[uVar12]) {
        uVar12 = uVar12 + 1;
        pMVar15 = pMVar10;
        pEntry = pMVar11;
        if (uVar7 == uVar12) goto LAB_0044c3c7;
      }
      ppMVar3 = &pMVar11->pNext;
      pMVar10 = pMVar11;
      pMVar11 = *ppMVar3;
    } while (*ppMVar3 != (Min_Cube_t *)0x0);
  }
  if ((uVar5 >> 0x16 < (uVar5 & 0x3ff)) &&
     (*(Min_Cube_t **)&pMVar13->field_0x8 != (Min_Cube_t *)0x0)) {
    pMVar14 = *(Min_Cube_t **)&pMVar13->field_0x8;
    pMVar13 = (Min_Cube_t *)&pMVar13->field_0x8;
LAB_0044c145:
    pMVar10 = pMVar14;
    if ((uVar5 & 0x3ffc00) != 0) goto code_r0x0044c154;
    goto LAB_0044c47e;
  }
LAB_0044c201:
  if (ppMVar1[uVar8] != (Min_Cube_t *)0x0) {
    pMVar13 = ppMVar1[uVar8];
    pMVar14 = (Min_Cube_t *)(ppMVar1 + uVar8);
LAB_0044c212:
    pMVar10 = pMVar13;
    if ((uVar5 & 0x3ffc00) != 0) goto code_r0x0044c221;
    goto LAB_0044c3f1;
  }
LAB_0044c2c9:
  if (0x3fffff < uVar5) {
    if (ppMVar1[(ulong)(uVar5 >> 0x16) - 1] != (Min_Cube_t *)0x0) {
      pMVar13 = ppMVar1[(ulong)(uVar5 >> 0x16) - 1];
      pMVar14 = (Min_Cube_t *)(ppMVar1 + ((ulong)(uVar5 >> 0x16) - 1));
LAB_0044c2f0:
      pMVar10 = pMVar13;
      if ((uVar5 & 0x3ffc00) != 0) goto code_r0x0044c2ff;
      goto LAB_0044c52d;
    }
  }
LAB_0044c3a7:
  pCube->pNext = ppMVar1[uVar5 >> 0x16];
  ppMVar1[uVar5 >> 0x16] = pCube;
  iVar4 = 0;
  iVar6 = 1;
  goto LAB_0044c51c;
code_r0x0044c154:
  pMVar14 = p->pTemp;
  uVar8 = 0;
  bVar2 = false;
  do {
    uVar12 = uVar8;
    while( true ) {
      uVar8 = uVar12 + 1;
      if (pCube->uData[uVar12] == pMVar10->uData[uVar12]) break;
      if ((bVar2) ||
         (uVar7 = pMVar10->uData[uVar12] ^ pCube->uData[uVar12],
         uVar7 = (uVar7 >> 1 | uVar7) & 0x55555555, (uVar7 & uVar7 - 1) != 0)) {
        pMVar14 = pMVar10->pNext;
        pMVar13 = pMVar10;
        if (pMVar10->pNext != (Min_Cube_t *)0x0) goto LAB_0044c145;
        uVar8 = (ulong)(uVar5 >> 0x16);
        goto LAB_0044c201;
      }
      if (pMVar14 != (Min_Cube_t *)0x0) {
        uVar7 = uVar7 * 3;
        bVar2 = true;
        goto LAB_0044c1c8;
      }
      bVar2 = true;
      uVar12 = uVar8;
      if ((uVar5 >> 10 & 0xfff) <= uVar8) goto LAB_0044c4b3;
    }
    uVar7 = 0;
    if (pMVar14 != (Min_Cube_t *)0x0) {
LAB_0044c1c8:
      pMVar14->uData[uVar12] = uVar7;
      uVar5 = *(uint *)&pCube->field_0x8;
    }
  } while (uVar8 < (uVar5 >> 10 & 0xfff));
  if (!bVar2) {
LAB_0044c47e:
    putchar(10);
    Min_CubeWrite(_stdout,pCube);
    Min_CubeWrite(_stdout,pMVar10);
    puts("Error: Min_CubesDistOne() looks at two equal cubes!");
  }
LAB_0044c4b3:
  pMVar13->pNext = pMVar10->pNext;
  uVar5 = *(uint *)&pCube->field_0x8;
  uVar7 = uVar5 >> 10 & 0xfff;
  if (uVar7 != 0) {
    pMVar13 = p->pTemp;
    uVar8 = 0;
    do {
      uVar9 = pMVar10->uData[uVar8] ^ pCube->uData[uVar8];
      pCube->uData[uVar8] = uVar9;
      pCube->uData[uVar8] = ~pMVar13->uData[uVar8] & pMVar10->uData[uVar8] | uVar9;
      uVar8 = uVar8 + 1;
    } while (uVar7 != uVar8);
  }
  iVar4 = uVar5 + 0x400000;
  goto LAB_0044c502;
code_r0x0044c2ff:
  pMVar13 = p->pTemp;
  uVar8 = 0;
  bVar2 = false;
  do {
    uVar12 = uVar8;
    while( true ) {
      uVar8 = uVar12 + 1;
      if (pCube->uData[uVar12] == pMVar10->uData[uVar12]) break;
      if ((bVar2) ||
         (uVar7 = pMVar10->uData[uVar12] ^ pCube->uData[uVar12],
         uVar7 = (uVar7 >> 1 | uVar7) & 0x55555555, (uVar7 & uVar7 - 1) != 0)) {
        pMVar13 = pMVar10->pNext;
        pMVar14 = pMVar10;
        if (pMVar10->pNext != (Min_Cube_t *)0x0) goto LAB_0044c2f0;
        goto LAB_0044c3a7;
      }
      if (pMVar13 != (Min_Cube_t *)0x0) {
        uVar7 = uVar7 * 3;
        bVar2 = true;
        goto LAB_0044c373;
      }
      bVar2 = true;
      uVar12 = uVar8;
      if ((uVar5 >> 10 & 0xfff) <= uVar8) goto LAB_0044c562;
    }
    uVar7 = 0;
    if (pMVar13 != (Min_Cube_t *)0x0) {
LAB_0044c373:
      pMVar13->uData[uVar12] = uVar7;
      uVar5 = *(uint *)&pCube->field_0x8;
    }
  } while (uVar8 < (uVar5 >> 10 & 0xfff));
  if (!bVar2) {
LAB_0044c52d:
    putchar(10);
    Min_CubeWrite(_stdout,pCube);
    Min_CubeWrite(_stdout,pMVar10);
    puts("Error: Min_CubesDistOne() looks at two equal cubes!");
  }
LAB_0044c562:
  pMVar14->pNext = pMVar10->pNext;
  uVar5 = *(uint *)&pCube->field_0x8 >> 10 & 0xfff;
  if (uVar5 != 0) {
    pMVar13 = p->pTemp;
    uVar8 = 0;
    do {
      uVar7 = pMVar10->uData[uVar8] ^ pCube->uData[uVar8];
      pCube->uData[uVar8] = uVar7;
      pCube->uData[uVar8] = ~pMVar13->uData[uVar8] & pMVar10->uData[uVar8] | uVar7;
      uVar8 = uVar8 + 1;
    } while (uVar5 != uVar8);
  }
  goto LAB_0044c506;
code_r0x0044c221:
  pMVar13 = p->pTemp;
  uVar8 = 0;
  bVar2 = false;
  do {
    uVar12 = uVar8;
    while( true ) {
      uVar8 = uVar12 + 1;
      if (pCube->uData[uVar12] == pMVar10->uData[uVar12]) break;
      if ((bVar2) ||
         (uVar7 = pMVar10->uData[uVar12] ^ pCube->uData[uVar12],
         uVar7 = (uVar7 >> 1 | uVar7) & 0x55555555, (uVar7 & uVar7 - 1) != 0)) {
        pMVar13 = pMVar10->pNext;
        pMVar14 = pMVar10;
        if (pMVar10->pNext != (Min_Cube_t *)0x0) goto LAB_0044c212;
        goto LAB_0044c2c9;
      }
      if (pMVar13 != (Min_Cube_t *)0x0) {
        uVar7 = uVar7 * 3;
        bVar2 = true;
        goto LAB_0044c295;
      }
      bVar2 = true;
      uVar12 = uVar8;
      if ((uVar5 >> 10 & 0xfff) <= uVar8) goto LAB_0044c426;
    }
    uVar7 = 0;
    if (pMVar13 != (Min_Cube_t *)0x0) {
LAB_0044c295:
      pMVar13->uData[uVar12] = uVar7;
      uVar5 = *(uint *)&pCube->field_0x8;
    }
  } while (uVar8 < (uVar5 >> 10 & 0xfff));
  if (!bVar2) {
LAB_0044c3f1:
    putchar(10);
    Min_CubeWrite(_stdout,pCube);
    Min_CubeWrite(_stdout,pMVar10);
    puts("Error: Min_CubesDistOne() looks at two equal cubes!");
  }
LAB_0044c426:
  pMVar14->pNext = pMVar10->pNext;
  uVar5 = *(uint *)&pCube->field_0x8;
  uVar7 = uVar5 >> 10 & 0xfff;
  if (uVar7 != 0) {
    pMVar13 = p->pTemp;
    uVar8 = 0;
    do {
      uVar9 = pMVar10->uData[uVar8] ^ pCube->uData[uVar8];
      pCube->uData[uVar8] = uVar9;
      pCube->uData[uVar8] = ~pMVar13->uData[uVar8] & pMVar10->uData[uVar8] | uVar9;
      uVar8 = uVar8 + 1;
    } while (uVar7 != uVar8);
  }
  iVar4 = uVar5 - 0x400000;
LAB_0044c502:
  *(int *)&pCube->field_0x8 = iVar4;
LAB_0044c506:
  Extra_MmFixedEntryRecycle(p->pMemMan,(char *)pMVar10);
  iVar4 = 1;
LAB_0044c517:
  iVar6 = -1;
LAB_0044c51c:
  p->nCubes = p->nCubes + iVar6;
  return iVar4;
}

Assistant:

int Min_EsopAddCubeInt( Min_Man_t * p, Min_Cube_t * pCube )
{
    Min_Cube_t * pThis, ** ppPrev;
    // try to find the identical cube
    Min_CoverForEachCubePrev( p->ppStore[pCube->nLits], pThis, ppPrev )
    {
        if ( Min_CubesAreEqual( pCube, pThis ) )
        {
            *ppPrev = pThis->pNext;
            Min_CubeRecycle( p, pCube );
            Min_CubeRecycle( p, pThis );
            p->nCubes--;
            return 0;
        }
    }
    // find a distance-1 cube if it exists
    if ( pCube->nLits < pCube->nVars )
    Min_CoverForEachCubePrev( p->ppStore[pCube->nLits+1], pThis, ppPrev )
    {
        if ( Min_CubesDistOne( pCube, pThis, p->pTemp ) )
        {
            *ppPrev = pThis->pNext;
            Min_CubesTransform( pCube, pThis, p->pTemp );
            pCube->nLits++;
            Min_CubeRecycle( p, pThis );
            p->nCubes--;
            return 1;
        }
    }
    Min_CoverForEachCubePrev( p->ppStore[pCube->nLits], pThis, ppPrev )
    {
        if ( Min_CubesDistOne( pCube, pThis, p->pTemp ) )
        {
            *ppPrev = pThis->pNext;
            Min_CubesTransform( pCube, pThis, p->pTemp );
            pCube->nLits--;
            Min_CubeRecycle( p, pThis );
            p->nCubes--;
            return 1;
        }
    }
    if ( pCube->nLits > 0 )
    Min_CoverForEachCubePrev( p->ppStore[pCube->nLits-1], pThis, ppPrev )
    {
        if ( Min_CubesDistOne( pCube, pThis, p->pTemp ) )
        {
            *ppPrev = pThis->pNext;
            Min_CubesTransform( pCube, pThis, p->pTemp );
            Min_CubeRecycle( p, pThis );
            p->nCubes--;
            return 1;
        }
    }
    // add the cube
    pCube->pNext = p->ppStore[pCube->nLits];
    p->ppStore[pCube->nLits] = pCube;
    p->nCubes++;
    return 0;
}